

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace.c
# Opt level: O2

void lace_start(uint _n_workers,size_t dqsize)

{
  size_t sVar1;
  uint uVar2;
  Worker **__s;
  WorkerP **ppWVar3;
  uint i;
  void *__arg;
  ulong uVar4;
  rlim_t __stacksize;
  ulong uVar5;
  rlimit lim;
  pthread_attr_t worker_attr;
  
  uVar2 = lace_get_pu_count();
  n_workers = _n_workers;
  if (_n_workers == 0) {
    n_workers = uVar2;
  }
  if (dqsize != 0) {
    default_dqsize = dqsize;
  }
  sVar1 = default_dqsize;
  LOCK();
  lace_quits = 0;
  UNLOCK();
  workers_running = 0;
  lace_bar.wait = 0;
  lace_bar._132_4_ = 0;
  lace_bar._136_8_ = 0;
  lace_bar._144_8_ = 0;
  lace_bar._152_8_ = 0;
  lace_bar._160_8_ = 0;
  lace_bar._168_8_ = 0;
  lace_bar._176_8_ = 0;
  lace_bar._184_8_ = 0;
  lace_bar.leaving = 0;
  lace_bar._68_4_ = 0;
  lace_bar._72_8_ = 0;
  lace_bar._80_8_ = 0;
  lace_bar._88_8_ = 0;
  lace_bar._96_8_ = 0;
  lace_bar._104_8_ = 0;
  lace_bar._112_8_ = 0;
  lace_bar._120_8_ = 0;
  lace_bar.count = 0;
  lace_bar._4_4_ = 0;
  lace_bar._8_8_ = 0;
  lace_bar._16_8_ = 0;
  lace_bar._24_8_ = 0;
  lace_bar._32_8_ = 0;
  lace_bar._40_8_ = 0;
  lace_bar._48_8_ = 0;
  lace_bar._56_8_ = 0;
  suspend_semaphore = (sem_t)(ZEXT432(0) << 0x40);
  sem_init((sem_t *)&suspend_semaphore,0,0);
  LOCK();
  must_suspend = 0;
  UNLOCK();
  LOCK();
  lace_awaken_count = 0;
  UNLOCK();
  uVar5 = (ulong)n_workers;
  uVar4 = uVar5 * 8 + 0x3f & 0xffffffffffffffc0;
  __s = (Worker **)aligned_alloc(0x40,uVar4);
  workers = __s;
  ppWVar3 = (WorkerP **)aligned_alloc(0x40,uVar4);
  workers_p = ppWVar3;
  workers_memory = (worker_data **)aligned_alloc(0x40);
  if (((__s != (Worker **)0x0) && (ppWVar3 != (WorkerP **)0x0)) &&
     (workers_memory != (worker_data **)0x0)) {
    memset(__s,0,uVar5 << 3);
    workers_memory_size = sVar1 * 0x40 + 0xc0;
    pthread_attr_init((pthread_attr_t *)&worker_attr);
    __stacksize = stacksize;
    if (stacksize == 0) {
      getrlimit(RLIMIT_STACK,(rlimit *)&lim);
      __stacksize = 0x1000000;
      if (lim.rlim_cur < 0x1000000) {
        __stacksize = lim.rlim_cur;
      }
    }
    pthread_attr_setstacksize((pthread_attr_t *)&worker_attr,__stacksize);
    if (verbosity == 0) {
      lace_newframe.t = (Task *)0x0;
    }
    else {
      fprintf(_stdout,"Initializing Lace, %u available cores, %d workers.\n",(ulong)uVar2,
              (ulong)n_workers);
      lace_newframe.t = (Task *)0x0;
      if (verbosity != 0) {
        fprintf(_stdout,"Lace startup, creating %d worker threads with program stack %zu bytes.\n",
                (ulong)n_workers,stacksize);
      }
    }
    for (__arg = (void *)0x0; __arg < (void *)(ulong)n_workers; __arg = (void *)((long)__arg + 1)) {
      pthread_create(&lim.rlim_cur,(pthread_attr_t *)&worker_attr,lace_worker_thread,__arg);
    }
    lace_resume();
    pthread_attr_destroy((pthread_attr_t *)&worker_attr);
    return;
  }
  fwrite("Lace error: unable to allocate memory for the workers!\n",0x37,1,_stderr);
  exit(1);
}

Assistant:

void
lace_start(unsigned int _n_workers, size_t dqsize)
{
#if LACE_USE_HWLOC
    // Initialize topology and information about cpus
    hwloc_topology_init(&topo);
    hwloc_topology_load(topo);

    n_nodes = hwloc_get_nbobjs_by_type(topo, HWLOC_OBJ_NODE);
    n_cores = hwloc_get_nbobjs_by_type(topo, HWLOC_OBJ_CORE);
    n_pus = hwloc_get_nbobjs_by_type(topo, HWLOC_OBJ_PU);
#else
    unsigned int n_pus = lace_get_pu_count();
#endif

    // Initialize globals
    n_workers = _n_workers == 0 ? n_pus : _n_workers;
    if (dqsize != 0) default_dqsize = dqsize;
    else dqsize = default_dqsize;
    lace_quits = 0;
    atomic_store_explicit(&workers_running, 0, memory_order_relaxed);

    // Initialize Lace barrier
    lace_barrier_init();

    // Create suspend semaphore
    memset(&suspend_semaphore, 0, sizeof(sem_t));
    sem_init(&suspend_semaphore, 0, 0);

    must_suspend = 0;
    lace_awaken_count = 0;

    // Allocate array with all workers
    // first make sure that the amount to allocate (n_workers times pointer) is a multiple of LINE_SIZE
    size_t to_allocate = n_workers * sizeof(void*);
    to_allocate = (to_allocate+LINE_SIZE-1) & (~(LINE_SIZE-1));
#if defined(_MSC_VER) || defined(__MINGW64_VERSION_MAJOR)
    workers = _aligned_malloc(to_allocate, LINE_SIZE);
    workers_p = _aligned_malloc(to_allocate, LINE_SIZE);
    workers_memory = _aligned_malloc(to_allocate, LINE_SIZE);
#elif defined(__MINGW32__)
    workers = __mingw_aligned_malloc(to_allocate, LINE_SIZE);
    workers_p = __mingw_aligned_malloc(to_allocate, LINE_SIZE);
    workers_memory = __mingw_aligned_malloc(to_allocate, LINE_SIZE);
#else
    workers = aligned_alloc(LINE_SIZE, to_allocate);
    workers_p = aligned_alloc(LINE_SIZE, to_allocate);
    workers_memory = aligned_alloc(LINE_SIZE, to_allocate);
#endif
    if (workers == 0 || workers_p == 0 || workers_memory == 0) {
        fprintf(stderr, "Lace error: unable to allocate memory for the workers!\n");
        exit(1);
    }

    // Ensure worker array is set to 0 initially
    memset(workers, 0, n_workers*sizeof(Worker*));

    // Compute memory size for each worker
    workers_memory_size = sizeof(worker_data) + sizeof(Task) * dqsize;

#ifndef __linux__
    // Create pthread key
    pthread_key_create(&current_worker_key, NULL);
#endif

    // Prepare structures for thread creation
    pthread_attr_t worker_attr;
    pthread_attr_init(&worker_attr);

    // Set the stack size
    if (stacksize != 0) {
        pthread_attr_setstacksize(&worker_attr, stacksize);
    } else {
	// on certain systems, the default stack size is too small (e.g. OSX)
	// so by default, we just pick the current RLIMIT_STACK or 16M whichever is smallest
#ifndef _WIN32
	struct rlimit lim;
	getrlimit(RLIMIT_STACK, &lim);
	size_t size = lim.rlim_cur;
	if (size > 16*1024*1024) size = 16*1024*1024;
#else
	size_t size = 16*1024*1024;
#endif
        pthread_attr_setstacksize(&worker_attr, size);
    }

    if (verbosity) {
#if LACE_USE_HWLOC
        fprintf(stdout, "Initializing Lace, %u nodes, %u cores, %u logical processors, %d workers.\n", n_nodes, n_cores, n_pus, n_workers);
#else
        fprintf(stdout, "Initializing Lace, %u available cores, %d workers.\n", n_pus, n_workers);
#endif
    }

    // Prepare lace_init structure
    atomic_store_explicit(&lace_newframe.t, NULL, memory_order_relaxed);

#if LACE_PIE_TIMES
    // Initialize counters for pie times
    us_elapsed_start();
    count_at_start = gethrtime();
#endif

    /* Report startup if verbose */
    if (verbosity) {
        fprintf(stdout, "Lace startup, creating %d worker threads with program stack %zu bytes.\n", n_workers, stacksize);
    }

    /* Spawn all workers */
    for (unsigned int i=0; i<n_workers; i++) {
        pthread_t res;
        pthread_create(&res, &worker_attr, lace_worker_thread, (void*)(size_t)i);
    }

    /* Make sure we start resumed */
    lace_resume();

    pthread_attr_destroy(&worker_attr);
}